

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port_signature_map_entry.c
# Opt level: O1

apx_portSignatureMapEntry_t * apx_portSignatureMapEntry_new(void)

{
  apx_portSignatureMapEntry_t *paVar1;
  
  paVar1 = (apx_portSignatureMapEntry_t *)malloc(0x48);
  if (paVar1 != (apx_portSignatureMapEntry_t *)0x0) {
    paVar1->preferred_provider = (apx_portInstance_t *)0x0;
    adt_list_create(&paVar1->require_ports,(_func_void_void_ptr *)0x0);
    adt_list_create(&paVar1->provide_ports,(_func_void_void_ptr *)0x0);
  }
  return paVar1;
}

Assistant:

apx_portSignatureMapEntry_t *apx_portSignatureMapEntry_new(void)
{
   apx_portSignatureMapEntry_t *self = (apx_portSignatureMapEntry_t*) malloc(sizeof(apx_portSignatureMapEntry_t));
   if(self != NULL)
   {
      apx_portSignatureMapEntry_create(self);
   }
   return self;
}